

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeVertexArrayApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::vertex_attribfv(NegativeTestContext *ctx)

{
  GLuint index;
  float v [4];
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_VALUE is generated if index is greater than or equal to GL_MAX_VERTEX_ATTRIBS."
             ,&local_39);
  NegativeTestContext::beginSection(ctx,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  index = NegativeTestContext::getInteger(ctx,0x8869);
  local_38._M_dataplus._M_p = (pointer)0x0;
  local_38._M_string_length = 0;
  glu::CallLogWrapper::glVertexAttrib1fv(&ctx->super_CallLogWrapper,index,(GLfloat *)&local_38);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glVertexAttrib2fv(&ctx->super_CallLogWrapper,index,(GLfloat *)&local_38);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glVertexAttrib3fv(&ctx->super_CallLogWrapper,index,(GLfloat *)&local_38);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glVertexAttrib4fv(&ctx->super_CallLogWrapper,index,(GLfloat *)&local_38);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void vertex_attribfv (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_INVALID_VALUE is generated if index is greater than or equal to GL_MAX_VERTEX_ATTRIBS.");
	int maxVertexAttribs = ctx.getInteger(GL_MAX_VERTEX_ATTRIBS);
	float v[4] = {0.0f};
	ctx.glVertexAttrib1fv(maxVertexAttribs, &v[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glVertexAttrib2fv(maxVertexAttribs, &v[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glVertexAttrib3fv(maxVertexAttribs, &v[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glVertexAttrib4fv(maxVertexAttribs, &v[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();
}